

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int arg_dbl_scanfn(arg_dbl *parent,char *argval)

{
  int iVar1;
  double dVar2;
  char *local_30;
  char *end;
  double val;
  char *pcStack_18;
  int errorcode;
  char *argval_local;
  arg_dbl *parent_local;
  
  val._4_4_ = 0;
  if (parent->count == (parent->hdr).maxcount) {
    val._4_4_ = 2;
  }
  else if (argval == (char *)0x0) {
    parent->count = parent->count + 1;
  }
  else {
    pcStack_18 = argval;
    argval_local = (char *)parent;
    dVar2 = strtod(argval,&local_30);
    if (*local_30 == '\0') {
      iVar1 = *(int *)(argval_local + 0x60);
      *(int *)(argval_local + 0x60) = iVar1 + 1;
      *(double *)(*(long *)(argval_local + 0x68) + (long)iVar1 * 8) = dVar2;
    }
    else {
      val._4_4_ = 5;
    }
  }
  return val._4_4_;
}

Assistant:

static int arg_dbl_scanfn(struct arg_dbl * parent, const char * argval) {
	int errorcode = 0;

	if (parent->count == parent->hdr.maxcount) {
		/* maximum number of arguments exceeded */
		errorcode = EMAXCOUNT;
	} else if (!argval) {
		/* a valid argument with no argument value was given. */
		/* This happens when an optional argument value was invoked. */
		/* leave parent argument value unaltered but still count the argument. */
		parent->count++;
	} else {
		double val;
		char * end;

		/* extract double from argval into val */
		val = strtod(argval, &end);

		/* if success then store result in parent->dval[] array otherwise return error*/
		if (*end == 0) {
			parent->dval[parent->count++] = val;
		} else {
			errorcode = EBADDOUBLE;
		}
	}

	ARG_TRACE(("%s:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
	return errorcode;
}